

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiles.hpp
# Opt level: O3

void __thiscall Tiles::unpack(Tiles *this,State *dst,PackedState s)

{
  long lVar1;
  bool bVar2;
  
  dst->blank = -1;
  dst->h = '\0';
  lVar1 = 0xf;
  do {
    dst->tiles[lVar1] = (byte)s.word & 0xf;
    if ((s.word & 0xf) == 0) {
      dst->blank = (char)lVar1;
    }
    else {
      dst->h = dst->h + (char)this[lVar1 * 4 + (ulong)(((uint)s.word & 0xf) << 6) + 0x40];
    }
    s.word = s.word >> 4;
    bVar2 = lVar1 != 0;
    lVar1 = lVar1 + -1;
  } while (bVar2);
  if (-1 < dst->blank) {
    return;
  }
  __assert_fail("dst.blank >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/shunjilin[P]15PuzzleExternalMemorySearch/src/tiles.hpp"
                ,0x93,"void Tiles::unpack(State &, PackedState) const");
}

Assistant:

void unpack(State &dst, PackedState s) const {
        dst.h = 0;
        dst.blank = -1;
        for (int i = Ntiles - 1; i >= 0; i--) {
            int t = s.word & 0xF;
            s.word >>= 4;
            dst.tiles[i] = t;
            if (t == 0)
                dst.blank = i;
            else
                dst.h += md[t][i];
        }
        assert (dst.blank >= 0);
    }